

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageSupport::ImageSupport
          (ImageSupport *this,ResourceDescription *resourceDesc,AccessMode mode,
          VkShaderStageFlagBits stage,DispatchCall dispatchCall)

{
  VkFormat VVar1;
  int i;
  long lVar2;
  char *pcVar3;
  
  (this->super_OperationSupport)._vptr_OperationSupport = (_func_int **)&PTR__ImageSupport_00d662c8;
  (this->m_resourceDesc).type = resourceDesc->type;
  lVar2 = 0;
  do {
    (this->m_resourceDesc).size.m_data[lVar2] = (resourceDesc->size).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  (this->m_resourceDesc).imageAspect = resourceDesc->imageAspect;
  VVar1 = resourceDesc->imageFormat;
  (this->m_resourceDesc).imageType = resourceDesc->imageType;
  (this->m_resourceDesc).imageFormat = VVar1;
  this->m_mode = mode;
  this->m_stage = stage;
  pcVar3 = "write_image_";
  if (mode == ACCESS_MODE_READ) {
    pcVar3 = "read_image_";
  }
  (this->m_shaderPrefix)._M_dataplus._M_p = (pointer)&(this->m_shaderPrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_shaderPrefix,pcVar3,
             pcVar3 + (0xc - (ulong)(mode == ACCESS_MODE_READ)));
  this->m_dispatchCall = dispatchCall;
  return;
}

Assistant:

ImageSupport (const ResourceDescription&	resourceDesc,
				  const AccessMode				mode,
				  const VkShaderStageFlagBits	stage,
				  const DispatchCall			dispatchCall = DISPATCH_CALL_DISPATCH)
		: m_resourceDesc	(resourceDesc)
		, m_mode			(mode)
		, m_stage			(stage)
		, m_shaderPrefix	(m_mode == ACCESS_MODE_READ ? "read_image_" : "write_image_")
		, m_dispatchCall	(dispatchCall)
	{
		DE_ASSERT(m_resourceDesc.type == RESOURCE_TYPE_IMAGE);
		DE_ASSERT(m_mode == ACCESS_MODE_READ || m_mode == ACCESS_MODE_WRITE);
		DE_ASSERT(m_dispatchCall == DISPATCH_CALL_DISPATCH || m_dispatchCall == DISPATCH_CALL_DISPATCH_INDIRECT);

		assertValidShaderStage(m_stage);
	}